

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O3

void __thiscall
glcts::PipelineStatisticsQueryTestAPICoverage1::deinit
          (PipelineStatisticsQueryTestAPICoverage1 *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  if (this->m_qo_id != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x458))(1,&this->m_qo_id);
    this->m_qo_id = 0;
  }
  return;
}

Assistant:

void PipelineStatisticsQueryTestAPICoverage1::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_qo_id != 0)
	{
		gl.deleteQueries(1, &m_qo_id);

		m_qo_id = 0;
	}
}